

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl_fileutils.c
# Opt level: O0

void mcu8str_append_cstr(mcu8str *str,char *c_str)

{
  mcu8str_size_t nsize;
  long lVar1;
  mcu8str *in_RSI;
  long *in_RDI;
  mcu8str_size_t newsize;
  mcu8str_size_t o_size;
  mcu8str_size_t in_stack_ffffffffffffffe8;
  
  nsize = mctools_strlen((char *)in_RSI,in_stack_ffffffffffffffe8);
  if (nsize != 0) {
    lVar1 = *(uint *)(in_RDI + 1) + nsize;
    if ((ulong)*(uint *)((long)in_RDI + 0xc) < lVar1 + 1U) {
      mcu8str_reserve(in_RSI,nsize);
    }
    memcpy((void *)(*in_RDI + (ulong)*(uint *)(in_RDI + 1)),in_RSI,nsize);
    *(undefined1 *)(*in_RDI + lVar1) = 0;
    *(int *)(in_RDI + 1) = (int)lVar1;
  }
  return;
}

Assistant:

void mcu8str_append_cstr( mcu8str* str, const char * c_str )
  {
    const mcu8str_size_t o_size = mctools_strlen( c_str, 0 );
    if ( o_size == 0 )
      return;
    const mcu8str_size_t newsize = str->size + o_size;
    if ( newsize + 1 > str->buflen )
      mcu8str_reserve( str, newsize );
    //memcpy ok since we handle the null char afterwards, there will be no
    //overlapping even if c_str = str.c_str:
    STDNS memcpy( str->c_str + str->size, c_str, o_size );
    str->c_str[newsize] = '\0';
    str->size = (unsigned)newsize;//cast ok, mcu8str_reserve checked.
  }